

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_subquery_expression.cpp
# Opt level: O3

void duckdb::ExtractSubqueryChildren
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child
               ,vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *result,vector<duckdb::LogicalType,_true> *types)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  pointer pEVar4;
  BoundFunctionExpression *pBVar5;
  const_reference type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *row_child;
  pointer __args;
  
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (child);
  if ((((pEVar4->return_type).id_ == STRUCT) &&
      (bVar2 = StructType::IsUnnamed(&pEVar4->return_type), bVar2)) &&
     (pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(child), (pEVar4->super_BaseExpression).expression_class == BOUND_FUNCTION)
     ) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(child);
    pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&pEVar4->super_BaseExpression);
    iVar3 = ::std::__cxx11::string::compare
                      ((char *)&(pBVar5->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name);
    if (iVar3 == 0) {
      if ((((long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x18) &&
          (type = vector<duckdb::LogicalType,_true>::operator[](types,0), type->id_ == STRUCT)) &&
         ((bVar2 = StructType::IsUnnamed(type), bVar2 &&
          ((long)(pBVar5->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pBVar5->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 !=
           ((long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)))) {
        return;
      }
      puVar1 = (pBVar5->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = (pBVar5->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != puVar1; __args = __args + 1
          ) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)result,__args);
      }
    }
  }
  return;
}

Assistant:

void ExtractSubqueryChildren(unique_ptr<Expression> &child, vector<unique_ptr<Expression>> &result,
                             const vector<LogicalType> &types) {
	// two scenarios
	// Single Expression (standard):
	// x IN (...)
	// Multi-Expression/Struct:
	// (a, b) IN (SELECT ...)
	// the latter has an unnamed struct on the LHS that is created by a "ROW" expression
	auto &return_type = child->return_type;
	if (!TypeIsUnnamedStruct(return_type)) {
		// child is not an unnamed struct
		return;
	}
	if (child->GetExpressionClass() != ExpressionClass::BOUND_FUNCTION) {
		// not a function
		return;
	}
	auto &function = child->Cast<BoundFunctionExpression>();
	if (function.function.name != "row") {
		// not "ROW"
		return;
	}
	// we found (a, b, ...) - we can extract all children of this function
	// note that we don't always want to do this
	if (types.size() == 1 && TypeIsUnnamedStruct(types[0]) && function.children.size() != types.size()) {
		// old case: we have an unnamed struct INSIDE the subquery as well
		// i.e. (a, b) IN (SELECT (a, b) ...)
		// unnesting the struct is guaranteed to throw an error - match the structs against each-other instead
		return;
	}
	for (auto &row_child : function.children) {
		result.push_back(std::move(row_child));
	}
}